

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::handleResize(Private *this,usize newWidth)

{
  String local_40;
  usize local_18;
  usize newWidth_local;
  Private *this_local;
  
  local_18 = newWidth;
  newWidth_local = (usize)this;
  promptClear(this);
  this->stdoutScreenWidth = local_18;
  String::String(&local_40);
  promptWrite(this,0,&local_40);
  String::~String(&local_40);
  return;
}

Assistant:

void handleResize(usize newWidth)
  {
    promptClear();
    stdoutScreenWidth = newWidth;
    promptWrite();
  }